

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O3

void cfl_subsample_hbd_420_16x4_ssse3(uint16_t *cfl_type,int input_stride,uint16_t *output_q3)

{
  short *psVar1;
  uint16_t *puVar2;
  bool bVar3;
  bool bVar4;
  uint16_t *puVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  puVar5 = cfl_type + 8;
  lVar6 = 0;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    puVar2 = puVar5 + (long)input_stride + -8;
    auVar7._0_2_ = *puVar2 + puVar5[-8];
    auVar7._2_2_ = puVar2[1] + puVar5[-7];
    auVar7._4_2_ = puVar2[2] + puVar5[-6];
    auVar7._6_2_ = puVar2[3] + puVar5[-5];
    auVar7._8_2_ = puVar2[4] + puVar5[-4];
    auVar7._10_2_ = puVar2[5] + puVar5[-3];
    auVar7._12_2_ = puVar2[6] + puVar5[-2];
    auVar7._14_2_ = puVar2[7] + puVar5[-1];
    puVar2 = puVar5 + input_stride;
    auVar8._0_2_ = *puVar2 + *puVar5;
    auVar8._2_2_ = puVar2[1] + puVar5[1];
    auVar8._4_2_ = puVar2[2] + puVar5[2];
    auVar8._6_2_ = puVar2[3] + puVar5[3];
    auVar8._8_2_ = puVar2[4] + puVar5[4];
    auVar8._10_2_ = puVar2[5] + puVar5[5];
    auVar8._12_2_ = puVar2[6] + puVar5[6];
    auVar8._14_2_ = puVar2[7] + puVar5[7];
    auVar8 = phaddw(auVar7,auVar8);
    psVar1 = (short *)((long)output_q3 + lVar6);
    *psVar1 = auVar8._0_2_ * 2;
    psVar1[1] = auVar8._2_2_ * 2;
    psVar1[2] = auVar8._4_2_ * 2;
    psVar1[3] = auVar8._6_2_ * 2;
    psVar1[4] = auVar8._8_2_ * 2;
    psVar1[5] = auVar8._10_2_ * 2;
    psVar1[6] = auVar8._12_2_ * 2;
    psVar1[7] = auVar8._14_2_ * 2;
    puVar5 = puVar5 + input_stride * 2;
    lVar6 = 0x40;
    bVar3 = false;
  } while (bVar4);
  return;
}

Assistant:

static inline void cfl_luma_subsampling_420_hbd_ssse3(const uint16_t *input,
                                                      int input_stride,
                                                      uint16_t *pred_buf_q3,
                                                      int width, int height) {
  const uint16_t *end = pred_buf_q3 + (height >> 1) * CFL_BUF_LINE;
  const int luma_stride = input_stride << 1;
  do {
    if (width == 4) {
      const __m128i top = _mm_loadl_epi64((__m128i *)input);
      const __m128i bot = _mm_loadl_epi64((__m128i *)(input + input_stride));
      __m128i sum = _mm_add_epi16(top, bot);
      sum = _mm_hadd_epi16(sum, sum);
      *((int *)pred_buf_q3) = _mm_cvtsi128_si32(_mm_add_epi16(sum, sum));
    } else {
      const __m128i top = _mm_loadu_si128((__m128i *)input);
      const __m128i bot = _mm_loadu_si128((__m128i *)(input + input_stride));
      __m128i sum = _mm_add_epi16(top, bot);
      if (width == 8) {
        sum = _mm_hadd_epi16(sum, sum);
        _mm_storel_epi64((__m128i *)pred_buf_q3, _mm_add_epi16(sum, sum));
      } else {
        const __m128i top_1 = _mm_loadu_si128(((__m128i *)input) + 1);
        const __m128i bot_1 =
            _mm_loadu_si128(((__m128i *)(input + input_stride)) + 1);
        sum = _mm_hadd_epi16(sum, _mm_add_epi16(top_1, bot_1));
        _mm_storeu_si128((__m128i *)pred_buf_q3, _mm_add_epi16(sum, sum));
        if (width == 32) {
          const __m128i top_2 = _mm_loadu_si128(((__m128i *)input) + 2);
          const __m128i bot_2 =
              _mm_loadu_si128(((__m128i *)(input + input_stride)) + 2);
          const __m128i top_3 = _mm_loadu_si128(((__m128i *)input) + 3);
          const __m128i bot_3 =
              _mm_loadu_si128(((__m128i *)(input + input_stride)) + 3);
          const __m128i sum_2 = _mm_add_epi16(top_2, bot_2);
          const __m128i sum_3 = _mm_add_epi16(top_3, bot_3);
          __m128i next_sum = _mm_hadd_epi16(sum_2, sum_3);
          _mm_storeu_si128(((__m128i *)pred_buf_q3) + 1,
                           _mm_add_epi16(next_sum, next_sum));
        }
      }
    }
    input += luma_stride;
  } while ((pred_buf_q3 += CFL_BUF_LINE) < end);
}